

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O2

void __thiscall
cnn::Conv1DWide::backward_impl
          (Conv1DWide *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Scalar SVar1;
  Scalar SVar2;
  pointer ppTVar3;
  Tensor *pTVar4;
  Tensor *pTVar5;
  undefined1 auVar6 [16];
  Scalar *pSVar7;
  ulong uVar8;
  uint k;
  ulong uVar9;
  ulong uVar10;
  uint j;
  ulong uVar11;
  uint i_1;
  ulong uVar12;
  ulong uVar13;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  
  if (i < 2) {
    ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar4 = *ppTVar3;
    pTVar5 = ppTVar3[1];
    uVar13 = 1;
    uVar10 = 1;
    if (1 < (pTVar4->d).nd) {
      uVar10 = (ulong)(pTVar4->d).d[1];
    }
    uVar8 = (ulong)(pTVar4->d).d[0];
    if (1 < (pTVar5->d).nd) {
      uVar13 = (ulong)(pTVar5->d).d[1];
    }
    Tensor::operator*(&d,dEdf);
    Tensor::operator*(&di,dEdxi);
    if (i == 0) {
      Tensor::operator*(&x,(xs->
                           super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                           )._M_impl.super__Vector_impl_data._M_start[1]);
      for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
        for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          uVar9 = 0;
          while (uVar13 != uVar9) {
            pSVar7 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&x,uVar12,uVar9);
            SVar1 = *pSVar7;
            pSVar7 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&d,uVar12,(ulong)(uint)((int)uVar11 + (int)uVar9));
            SVar2 = *pSVar7;
            pSVar7 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&di,uVar12,uVar11);
            uVar9 = uVar9 + 1;
            auVar6 = vfmadd213ss_fma(ZEXT416((uint)SVar2),ZEXT416((uint)SVar1),
                                     ZEXT416((uint)*pSVar7));
            *pSVar7 = auVar6._0_4_;
          }
        }
      }
    }
    else {
      Tensor::operator*(&x,*(xs->
                            super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start);
      for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
        for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          pSVar7 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 *)&x,uVar12,uVar11);
          SVar1 = *pSVar7;
          uVar9 = 0;
          while (uVar13 != uVar9) {
            pSVar7 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&d,uVar12,(ulong)(uint)((int)uVar11 + (int)uVar9));
            SVar2 = *pSVar7;
            pSVar7 = Eigen::
                     DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   *)&di,uVar12,uVar9);
            uVar9 = uVar9 + 1;
            auVar6 = vfmadd213ss_fma(ZEXT416((uint)SVar2),ZEXT416((uint)SVar1),
                                     ZEXT416((uint)*pSVar7));
            *pSVar7 = auVar6._0_4_;
          }
        }
      }
    }
    return;
  }
  __assert_fail("i < 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                ,0xe9,
                "virtual void cnn::Conv1DWide::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Conv1DWide::backward_impl(const vector<const Tensor*>& xs,
                          const Tensor& fx,
                          const Tensor& dEdf,
                          unsigned i,
                          Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DWide::backward not implemented for CUDA");
#else
  assert(i < 2);
  const unsigned rows = xs[0]->d.rows();
  const unsigned xcols = xs[0]->d.cols();
  const unsigned fcols = xs[1]->d.cols();
  auto d = *dEdf;
  auto di = *dEdxi;
  if (i == 0) { // derivative wrt input x
    auto f = **xs[1];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < xcols; ++j) {
        for (unsigned k = 0; k < fcols; ++k)
          di(i, j) += f(i, k) * d(i, j + k);
      }
    }
  } else { // derivative wrt filter f
    auto x = **xs[0];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < xcols; ++j) {
        const float xij = x(i, j);
        for (unsigned k = 0; k < fcols; ++k)
          di(i, k) += xij * d(i, j + k);
      }
    }
  }
#endif
}